

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall
QDomElementPrivate::save(QDomElementPrivate *this,QTextStream *s,int depth,int indent)

{
  QDomNodePrivate *pQVar1;
  QDomNamedNodeMapPrivate *pQVar2;
  long *plVar3;
  long lVar4;
  Data *pDVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char cVar11;
  int iVar12;
  longlong __old_val;
  QTextStream *pQVar13;
  undefined1 *puVar14;
  ulong uVar15;
  qsizetype in_R8;
  long lVar16;
  long lVar17;
  SavedAttribute *__i;
  QString *pQVar18;
  long in_FS_OFFSET;
  QStringView QVar19;
  QStringView QVar20;
  pair<std::__detail::_Node_iterator<QString,_true,_true>,_bool> pVar21;
  QDuplicateTracker<QString,_32UL> outputtedPrefixes;
  QString local_a48;
  SavedAttribute local_a28;
  SavedAttribute local_9d8;
  const_key_value_iterator local_988;
  QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&> local_970;
  QString local_968;
  QString local_948;
  undefined1 local_928 [16];
  qsizetype local_918;
  QArrayData *local_910;
  char16_t *pcStack_908;
  qsizetype local_900;
  char16_t local_8f8;
  monotonic_buffer_resource local_328 [64];
  undefined1 local_2e8 [80];
  undefined1 local_298 [24];
  QString local_280 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QDomNodePrivate).prev;
  if ((pQVar1 == (QDomNodePrivate *)0x0) ||
     (iVar12 = (*pQVar1->_vptr_QDomNodePrivate[0xb])(), 1 < iVar12 - 3U)) {
    iVar12 = 0;
    if (0 < indent) {
      iVar12 = depth * indent;
    }
    QString::QString((QString *)local_928,(long)iVar12,(QChar)0x20);
    QTextStream::operator<<(s,(QString *)local_928);
    if ((QArrayData *)local_928._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_928._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_928._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_928._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_928._0_8_,2,0x10);
      }
    }
  }
  local_948.d.d = (this->super_QDomNodePrivate).name.d.d;
  local_948.d.ptr = (this->super_QDomNodePrivate).name.d.ptr;
  local_948.d.size = (this->super_QDomNodePrivate).name.d.size;
  if (&(local_948.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_948.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_948.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_968.d.d = (Data *)0x0;
  local_968.d.ptr = L"";
  local_968.d.size = 0;
  if ((this->super_QDomNodePrivate).namespaceURI.d.ptr != (char16_t *)0x0) {
    if ((this->super_QDomNodePrivate).prefix.d.size == 0) {
      local_968.d.ptr = L" xmlns";
      local_968.d.size = 6;
    }
    else {
      local_298._16_8_ = &(this->super_QDomNodePrivate).name;
      pQVar18 = &(this->super_QDomNodePrivate).prefix;
      local_298._8_2_ = 0x3a;
      local_298._0_8_ = pQVar18;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)local_928,
                 (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 local_298);
      qVar6 = local_918;
      uVar9 = local_928._0_8_;
      pcVar8 = local_948.d.ptr;
      pDVar5 = local_948.d.d;
      local_928._0_8_ = local_948.d.d;
      local_948.d.d = (Data *)uVar9;
      local_948.d.ptr = (char16_t *)local_928._8_8_;
      local_928._8_8_ = pcVar8;
      local_918 = local_948.d.size;
      local_948.d.size = qVar6;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      local_928._0_8_ = (QArrayData *)0x0;
      local_928._8_8_ = L" xmlns:";
      local_918 = 7;
      local_910 = (QArrayData *)pQVar18;
      QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                ((QString *)local_298,(QStringBuilder<QString,_const_QString_&> *)local_928);
      uVar10 = local_298._16_8_;
      uVar9 = local_298._0_8_;
      pcVar8 = local_968.d.ptr;
      pDVar5 = local_968.d.d;
      local_298._0_8_ = local_968.d.d;
      local_968.d.d = (Data *)uVar9;
      local_968.d.ptr = (char16_t *)local_298._8_8_;
      local_298._8_8_ = pcVar8;
      local_298._16_8_ = local_968.d.size;
      local_968.d.size = uVar10;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_928._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_928._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_928._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_928._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_928._0_8_,2,0x10);
        }
      }
    }
    in_R8 = 0;
    encodeText(&local_9d8.prefix,&(this->super_QDomNodePrivate).namespaceURI,true,false,false);
    local_298._0_8_ = (QArrayData *)0x0;
    local_928._0_8_ = (QArrayData *)0x0;
    local_298._8_8_ = (char16_t *)0x0;
    local_298._16_8_ = (QString *)0x0;
    local_928._8_8_ = L"=\"";
    local_918 = 2;
    local_280[0].d.d = (Data *)0x0;
    local_280[0].d.ptr = (char16_t *)0x0;
    local_910 = &(local_9d8.prefix.d.d)->super_QArrayData;
    pcStack_908 = local_9d8.prefix.d.ptr;
    local_280[0].d.size = 0;
    local_900 = local_9d8.prefix.d.size;
    local_8f8 = L'\"';
    operator+=(&local_968,(QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *)local_928);
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_928)
    ;
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_298)
    ;
  }
  pQVar13 = (QTextStream *)QTextStream::operator<<(s,'<');
  pQVar13 = (QTextStream *)QTextStream::operator<<(pQVar13,&local_948);
  QTextStream::operator<<(pQVar13,&local_968);
  pQVar2 = this->m_attr;
  if ((pQVar2->map).m_size != 0) {
    memset(local_280,0xaa,0x240);
    local_298._0_8_ = (QArrayData *)0x8;
    local_298._8_8_ = (char16_t *)0x0;
    lVar17 = (pQVar2->map).m_size;
    local_298._16_8_ = local_280;
    if (8 < lVar17) {
      QVLABase<SavedAttribute>::reallocate_impl
                ((QVLABase<SavedAttribute> *)local_298,(qsizetype)local_280,(void *)0x0,lVar17,in_R8
                );
    }
    memcpy((QDuplicateTracker<QString,_32UL> *)local_928,&DAT_001200f0,0x688);
    QDuplicateTracker<QString,_32UL>::QDuplicateTracker
              ((QDuplicateTracker<QString,_32UL> *)local_928);
    local_970.super_QKeyValueRangeStorage<const_QMultiHash<QString,_QDomNodePrivate_*>_&>.m_map =
         (QKeyValueRangeStorage<const_QMultiHash<QString,_QDomNodePrivate_*>_&>)&this->m_attr->map;
    local_988.i.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_988.i.i.d =
         (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_988.i.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::QKeyValueRange<const_QMultiHash<QString,_QDomNodePrivate_*>_&>::begin
              (&local_988,&local_970);
    if (local_988.i.e != (Chain **)0x0) {
      do {
        plVar3 = (long *)*local_988.i.e;
        local_9d8.encodedValue.d.d = (Data *)0x0;
        local_9d8.encodedValue.d.ptr = (char16_t *)0x0;
        local_9d8.name.d.ptr = (char16_t *)0x0;
        local_9d8.name.d.size = 0;
        local_9d8.prefix.d.size = 0;
        local_9d8.name.d.d = (Data *)0x0;
        local_9d8.prefix.d.d = (Data *)0x0;
        local_9d8.prefix.d.ptr = (char16_t *)0x0;
        local_9d8.encodedValue.d.size = 0;
        QString::operator=(&local_9d8.name,(QString *)(*plVar3 + 0x38));
        encodeText(&local_a28.prefix,(QString *)(*plVar3 + 0x50),true,true,false);
        pcVar8 = local_9d8.encodedValue.d.ptr;
        pDVar7 = local_9d8.encodedValue.d.d;
        qVar6 = local_a28.prefix.d.size;
        pDVar5 = local_a28.prefix.d.d;
        local_a28.prefix.d.d = local_9d8.encodedValue.d.d;
        local_9d8.encodedValue.d.d = pDVar5;
        local_9d8.encodedValue.d.ptr = local_a28.prefix.d.ptr;
        local_a28.prefix.d.ptr = pcVar8;
        local_a28.prefix.d.size = local_9d8.encodedValue.d.size;
        local_9d8.encodedValue.d.size = qVar6;
        if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
          }
        }
        if (*(long *)(*plVar3 + 0x88) == 0) {
          QVarLengthArray<SavedAttribute,_8LL>::push_back
                    ((QVarLengthArray<SavedAttribute,_8LL> *)local_298,&local_9d8);
        }
        else {
          QString::operator=(&local_9d8.prefix,(QString *)(*plVar3 + 0x68));
          QVarLengthArray<SavedAttribute,_8LL>::push_back
                    ((QVarLengthArray<SavedAttribute,_8LL> *)local_298,&local_9d8);
          lVar17 = *plVar3;
          lVar16 = *(long *)(lVar17 + 0x20);
          if (((lVar16 == 0) ||
              (lVar4 = *(long *)(lVar16 + 0x78), lVar4 != *(long *)(lVar17 + 0x78))) ||
             (QVar19.m_data = *(storage_type_conflict **)(lVar16 + 0x70), QVar19.m_size = lVar4,
             QVar20.m_data = *(storage_type_conflict **)(lVar17 + 0x70), QVar20.m_size = lVar4,
             cVar11 = QtPrivate::equalStrings(QVar19,QVar20), cVar11 == '\0')) {
            local_a28.prefix.d.d = (Data *)(local_2e8 + 8);
            pVar21 = std::
                     _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                               ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)local_2e8,lVar17 + 0x68,&local_a28);
            if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_a28.prefix.d.d = (Data *)0x0;
              local_a28.name.d.d = (Data *)0x0;
              local_a28.encodedValue.d.d = (Data *)0x0;
              local_a28.encodedValue.d.ptr = (char16_t *)0x0;
              local_a28.name.d.ptr = (char16_t *)0x0;
              local_a28.name.d.size = 0;
              local_a28.encodedValue.d.size = 0;
              local_a28.prefix.d.ptr = L"xmlns";
              local_a28.prefix.d.size = 5;
              QString::operator=(&local_a28.name,(QString *)(*plVar3 + 0x68));
              encodeText(&local_a48,(QString *)(*plVar3 + 0x80),true,true,false);
              pcVar8 = local_a28.encodedValue.d.ptr;
              pDVar7 = local_a28.encodedValue.d.d;
              qVar6 = local_a48.d.size;
              pDVar5 = local_a48.d.d;
              local_a48.d.d = local_a28.encodedValue.d.d;
              local_a28.encodedValue.d.d = pDVar5;
              local_a28.encodedValue.d.ptr = local_a48.d.ptr;
              local_a48.d.ptr = pcVar8;
              local_a48.d.size = local_a28.encodedValue.d.size;
              local_a28.encodedValue.d.size = qVar6;
              if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                }
              }
              QVarLengthArray<SavedAttribute,_8LL>::push_back
                        ((QVarLengthArray<SavedAttribute,_8LL> *)local_298,&local_a28);
              if (&(local_a28.encodedValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a28.encodedValue.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_a28.encodedValue.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_a28.encodedValue.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_a28.encodedValue.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_a28.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a28.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_a28.name.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_a28.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_a28.name.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_a28.prefix.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a28.prefix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i = ((local_a28.prefix.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_a28.prefix.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&(local_a28.prefix.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
        }
        if (&(local_9d8.encodedValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_9d8.encodedValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_9d8.encodedValue.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_9d8.encodedValue.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_9d8.encodedValue.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_9d8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_9d8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_9d8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_9d8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_9d8.name.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_9d8.prefix.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_9d8.prefix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_9d8.prefix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_9d8.prefix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_9d8.prefix.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar17 = (long)*local_988.i.e;
        local_988.i.e = (Chain **)(lVar17 + 8);
        if (*(long *)(lVar17 + 8) == 0) {
          puVar14 = (undefined1 *)local_988.i.i.bucket;
          do {
            local_988.i.i.bucket = (size_t)(puVar14 + 1);
            if ((undefined1 *)((local_988.i.i.d)->numBuckets - 1) == puVar14) {
              local_988.i.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0;
              local_988.i.i.bucket = 0;
              local_988.i.e = (Chain **)0x0;
              goto LAB_00113ff6;
            }
            uVar15 = local_988.i.i.bucket >> 7;
            puVar14 = (undefined1 *)local_988.i.i.bucket;
          } while ((local_988.i.i.d)->spans[uVar15].offsets[(uint)local_988.i.i.bucket & 0x7f] ==
                   0xff);
          local_988.i.e =
               (Chain **)
               ((local_988.i.i.d)->spans[uVar15].entries
                [(local_988.i.i.d)->spans[uVar15].offsets[(uint)local_988.i.i.bucket & 0x7f]].
                storage.data + 0x18);
        }
LAB_00113ff6:
      } while (local_988.i.e != (Chain **)0x0);
    }
    uVar10 = local_298._16_8_;
    uVar9 = local_298._8_8_;
    if ((char16_t *)local_298._8_8_ != (char16_t *)0x0) {
      lVar16 = local_298._8_8_ * 0x48;
      pQVar18 = (QString *)(local_298._16_8_ + local_298._8_8_ * 3 * 0x18);
      lVar17 = 0x3f;
      if ((char16_t *)local_298._8_8_ != (char16_t *)0x0) {
        for (; (ulong)local_298._8_8_ >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,long,__gnu_cxx::__ops::_Iter_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                (local_298._16_8_,pQVar18,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)uVar9 < 0x11) {
        std::
        __insertion_sort<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,__gnu_cxx::__ops::_Iter_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                  (uVar10,pQVar18);
      }
      else {
        pQVar18 = (QString *)(uVar10 + 0x480);
        std::
        __insertion_sort<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,__gnu_cxx::__ops::_Iter_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                  (uVar10,pQVar18);
        lVar16 = lVar16 + -0x480;
        do {
          std::
          __unguarded_linear_insert<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,__gnu_cxx::__ops::_Val_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                    (pQVar18);
          pQVar18 = pQVar18 + 3;
          lVar16 = lVar16 + -0x48;
        } while (lVar16 != 0);
      }
      if ((char16_t *)local_298._8_8_ != (char16_t *)0x0) {
        pQVar18 = (QString *)(local_298._16_8_ + 0x18);
        lVar17 = local_298._8_8_ * 0x48;
        do {
          QTextStream::operator<<(s,' ');
          if (pQVar18[-1].d.size != 0) {
            pQVar13 = (QTextStream *)QTextStream::operator<<(s,pQVar18 + -1);
            QTextStream::operator<<(pQVar13,':');
          }
          pQVar13 = (QTextStream *)QTextStream::operator<<(s,pQVar18);
          pQVar13 = (QTextStream *)QTextStream::operator<<(pQVar13,"=\"");
          pQVar13 = (QTextStream *)QTextStream::operator<<(pQVar13,pQVar18 + 1);
          QTextStream::operator<<(pQVar13,'\"');
          pQVar18 = pQVar18 + 3;
          lVar17 = lVar17 + -0x48;
        } while (lVar17 != 0);
      }
    }
    std::
    _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_2e8);
    std::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(local_328);
    if (0 < (long)local_298._8_8_) {
      lVar17 = local_298._8_8_ + 1;
      pQVar18 = (QString *)local_298._16_8_;
      do {
        pDVar5 = pQVar18[2].d.d;
        if (pDVar5 != (Data *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(pQVar18[2].d.d)->super_QArrayData,2,0x10);
          }
        }
        pDVar5 = pQVar18[1].d.d;
        if (pDVar5 != (Data *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(pQVar18[1].d.d)->super_QArrayData,2,0x10);
          }
        }
        pDVar5 = (pQVar18->d).d;
        if (pDVar5 != (Data *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pQVar18->d).d)->super_QArrayData,2,0x10);
          }
        }
        pQVar18 = pQVar18 + 3;
        lVar17 = lVar17 + -1;
      } while (1 < lVar17);
    }
    if ((QString *)local_298._16_8_ != local_280) {
      QtPrivate::sizedFree((void *)local_298._16_8_,local_298._0_8_ * 0x48);
    }
  }
  if ((this->super_QDomNodePrivate).last == (QDomNodePrivate *)0x0) {
    QTextStream::operator<<(s,"/>");
  }
  else {
    iVar12 = (*((this->super_QDomNodePrivate).first)->_vptr_QDomNodePrivate[0xb])();
    QTextStream::operator<<(s,'>');
    if (indent != -1 && 1 < iVar12 - 3U) {
      Qt::endl(s);
    }
  }
  if (&(local_968.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_968.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_968.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_968.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_968.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_948.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_948.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_948.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_948.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_948.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomElementPrivate::save(QTextStream& s, int depth, int indent) const
{
    if (!(prev && prev->isText()))
        s << QString(indent < 1 ? 0 : depth * indent, u' ');

    QString qName(name);
    QString nsDecl(u""_s);
    if (!namespaceURI.isNull()) {
        /** ###
         *
         * If we still have QDom, optimize this so that we only declare namespaces that are not
         * yet declared. We loose default namespace mappings, so maybe we should rather store
         * the information that we get from startPrefixMapping()/endPrefixMapping() and use them.
         * Modifications becomes more complex then, however.
         *
         * We cannot do this in a patch release because it would require too invasive changes, and
         * hence possibly behavioral changes.
         */
        if (prefix.isEmpty()) {
            nsDecl = u" xmlns"_s;
        } else {
            qName = prefix + u':' + name;
            nsDecl = u" xmlns:"_s + prefix;
        }
        nsDecl += u"=\""_s + encodeText(namespaceURI) + u'\"';
    }
    s << '<' << qName << nsDecl;


    /* Write out attributes. */
    if (!m_attr->map.isEmpty()) {
        /*
         * To ensure that we always output attributes in a consistent
         * order, sort the attributes before writing them into the
         * stream. (Note that the order may be different than the one
         * that e.g. we've read from a file, or the program order in
         * which these attributes have been populated. We just want to
         * guarantee reproducibile outputs.)
         */
        struct SavedAttribute {
            QString prefix;
            QString name;
            QString encodedValue;
        };

        /* Gather all the attributes to save. */
        QVarLengthArray<SavedAttribute, 8> attributesToSave;
        attributesToSave.reserve(m_attr->map.size());

        QDuplicateTracker<QString> outputtedPrefixes;
        for (const auto &[key, value] : std::as_const(m_attr->map).asKeyValueRange()) {
            Q_UNUSED(key); /* We extract the attribute name from the value. */
            bool mayNeedXmlNS = false;

            SavedAttribute attr;
            attr.name = value->name;
            attr.encodedValue = encodeText(value->value, true, true);
            if (!value->namespaceURI.isNull()) {
                attr.prefix = value->prefix;
                mayNeedXmlNS = true;
            }

            attributesToSave.push_back(std::move(attr));

            /*
             * This is a fix for 138243, as good as it gets.
             *
             * QDomElementPrivate::save() output a namespace
             * declaration if the element is in a namespace, no matter
             * what. This function do as well, meaning that we get two
             * identical namespace declaration if we don't have the if-
             * statement below.
             *
             * This doesn't work when the parent element has the same
             * prefix as us but a different namespace. However, this
             * can only occur by the user modifying the element, and we
             * don't do fixups by that anyway, and hence it's the user
             * responsibility to avoid those situations.
             */

            if (mayNeedXmlNS
                && ((!value->ownerNode || value->ownerNode->prefix != value->prefix)
                    && !outputtedPrefixes.hasSeen(value->prefix)))
            {
                SavedAttribute nsAttr;
                nsAttr.prefix = QStringLiteral("xmlns");
                nsAttr.name = value->prefix;
                nsAttr.encodedValue = encodeText(value->namespaceURI, true, true);
                attributesToSave.push_back(std::move(nsAttr));
            }
        }

        /* Sort the attributes by prefix and name. */
        const auto savedAttributeComparator = [](const SavedAttribute &lhs, const SavedAttribute &rhs)
        {
            const int cmp = QString::compare(lhs.prefix, rhs.prefix);
            return (cmp < 0) || ((cmp == 0) && (lhs.name < rhs.name));
        };

        std::sort(attributesToSave.begin(), attributesToSave.end(), savedAttributeComparator);

        /* Actually stream the sorted attributes. */
        for (const auto &attr : attributesToSave) {
            s << ' ';
            if (!attr.prefix.isEmpty())
                s << attr.prefix << ':';
            s << attr.name << "=\"" << attr.encodedValue << '\"';
        }
    }

    if (last) {
        // has child nodes
        if (first->isText())
            s << '>';
        else {
            s << '>';

            /* -1 disables new lines. */
            if (indent != -1)
                s << Qt::endl;
        }
    } else {
        s << "/>";
    }
}